

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.h
# Opt level: O2

void __thiscall QFont::setVariableAxis(QFont *this,Tag tag,float value)

{
  byte *pbVar1;
  bool bVar2;
  
  if ((tag.m_value != 0) &&
     (((this->resolve_mask & 0x80000) == 0 ||
      (bVar2 = QFontPrivate::hasVariableAxis((this->d).d.ptr,tag,value), !bVar2)))) {
    detach(this);
    QFontPrivate::setVariableAxis((this->d).d.ptr,tag,value);
    pbVar1 = (byte *)((long)&this->resolve_mask + 2);
    *pbVar1 = *pbVar1 | 8;
  }
  return;
}

Assistant:

constexpr bool isValid() const noexcept { return m_value != 0; }